

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

CompileInfo * __thiscall cmGeneratorTarget::GetCompileInfo(cmGeneratorTarget *this,string *config)

{
  bool bVar1;
  TargetType TVar2;
  string *b;
  string *args_1;
  ulong uVar3;
  pointer ppVar4;
  __enable_if_t<is_constructible<value_type,_pair<const_basic_string<char>,_CompileInfo>_&>::value,_pair<iterator,_bool>_>
  _Var5;
  undefined1 local_128 [8];
  value_type entry;
  string local_e0;
  undefined1 local_c0 [8];
  CompileInfo info;
  _Self local_98;
  iterator i;
  undefined1 local_70 [8];
  string config_upper;
  undefined1 local_40 [8];
  string msg;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  msg.field_2._8_8_ = config;
  bVar1 = IsImported(this);
  if (bVar1) {
    this_local = (cmGeneratorTarget *)0x0;
  }
  else {
    TVar2 = GetType(this);
    if ((int)TVar2 < 5) {
      std::__cxx11::string::string((string *)local_70);
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        cmsys::SystemTools::UpperCase((string *)&i,(string *)msg.field_2._8_8_);
        std::__cxx11::string::operator=((string *)local_70,(string *)&i);
        std::__cxx11::string::~string((string *)&i);
      }
      local_98._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::CompileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::CompileInfo>_>_>
           ::find(&this->CompileInfoMap,(key_type *)local_70);
      info.CompilePdbDir.field_2._8_8_ =
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::CompileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::CompileInfo>_>_>
           ::end(&this->CompileInfoMap);
      bVar1 = std::operator==(&local_98,(_Self *)((long)&info.CompilePdbDir.field_2 + 8));
      if (bVar1) {
        CompileInfo::CompileInfo((CompileInfo *)local_c0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e0,"COMPILE_PDB",
                   (allocator<char> *)(entry.second.CompilePdbDir.field_2._M_local_buf + 0xf));
        ComputePDBOutputDir(this,&local_e0,(string *)msg.field_2._8_8_,(string *)local_c0);
        std::__cxx11::string::~string((string *)&local_e0);
        std::allocator<char>::~allocator
                  ((allocator<char> *)(entry.second.CompilePdbDir.field_2._M_local_buf + 0xf));
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::CompileInfo>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_cmGeneratorTarget::CompileInfo_&,_true>
                  ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::CompileInfo>
                    *)local_128,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                   (CompileInfo *)local_c0);
        _Var5 = std::
                map<std::__cxx11::string,cmGeneratorTarget::CompileInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmGeneratorTarget::CompileInfo>>>
                ::insert<std::pair<std::__cxx11::string_const,cmGeneratorTarget::CompileInfo>&>
                          ((map<std::__cxx11::string,cmGeneratorTarget::CompileInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmGeneratorTarget::CompileInfo>>>
                            *)&this->CompileInfoMap,
                           (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::CompileInfo>
                            *)local_128);
        local_98._M_node = (_Base_ptr)_Var5.first._M_node;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::CompileInfo>
        ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::CompileInfo>
                 *)local_128);
        CompileInfo::~CompileInfo((CompileInfo *)local_c0);
      }
      ppVar4 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::CompileInfo>_>
               ::operator->(&local_98);
      this_local = (cmGeneratorTarget *)&ppVar4->second;
      std::__cxx11::string::~string((string *)local_70);
    }
    else {
      b = GetName_abi_cxx11_(this);
      TVar2 = GetType(this);
      args_1 = cmState::GetTargetTypeName_abi_cxx11_(TVar2);
      cmStrCat<char_const(&)[37],std::__cxx11::string_const&,char_const(&)[17],std::__cxx11::string_const&>
                ((string *)local_40,(char (*) [37])"cmTarget::GetCompileInfo called for ",b,
                 (char (*) [17])" which has type ",args_1);
      cmLocalGenerator::IssueMessage(this->LocalGenerator,INTERNAL_ERROR,(string *)local_40);
      this_local = (cmGeneratorTarget *)0x0;
      std::__cxx11::string::~string((string *)local_40);
    }
  }
  return (CompileInfo *)this_local;
}

Assistant:

cmGeneratorTarget::CompileInfo const* cmGeneratorTarget::GetCompileInfo(
  const std::string& config) const
{
  // There is no compile information for imported targets.
  if (this->IsImported()) {
    return nullptr;
  }

  if (this->GetType() > cmStateEnums::OBJECT_LIBRARY) {
    std::string msg = cmStrCat("cmTarget::GetCompileInfo called for ",
                               this->GetName(), " which has type ",
                               cmState::GetTargetTypeName(this->GetType()));
    this->LocalGenerator->IssueMessage(MessageType::INTERNAL_ERROR, msg);
    return nullptr;
  }

  // Lookup/compute/cache the compile information for this configuration.
  std::string config_upper;
  if (!config.empty()) {
    config_upper = cmSystemTools::UpperCase(config);
  }
  auto i = this->CompileInfoMap.find(config_upper);
  if (i == this->CompileInfoMap.end()) {
    CompileInfo info;
    this->ComputePDBOutputDir("COMPILE_PDB", config, info.CompilePdbDir);
    CompileInfoMapType::value_type entry(config_upper, info);
    i = this->CompileInfoMap.insert(entry).first;
  }
  return &i->second;
}